

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ans_util.hpp
# Opt level: O3

vector<unsigned_int,_std::allocator<unsigned_int>_> *
ans_load_interp(vector<unsigned_int,_std::allocator<unsigned_int>_> *__return_storage_ptr__,
               uint8_t *in_u8)

{
  uint32_t *puVar1;
  uint *puVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  uint uVar5;
  byte bVar6;
  uint32_t uVar7;
  uint uVar8;
  uint8_t c;
  size_t n;
  ulong uVar9;
  uint uVar10;
  uint32_t *puVar11;
  ushort uVar12;
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  bit_stream local_78;
  
  uVar10 = 0;
  uVar8 = 0;
  puVar1 = (uint32_t *)(in_u8 + 5);
  do {
    puVar11 = puVar1;
    uVar5 = uVar8 & 0x1f;
    uVar8 = uVar8 + 7;
    uVar10 = uVar10 + ((*(byte *)((long)puVar11 + -5) & 0x7f) << uVar5);
    puVar1 = (uint32_t *)((long)puVar11 + 1);
  } while ((char)*(byte *)((long)puVar11 + -5) < '\0');
  uVar7 = puVar11[-1];
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (__return_storage_ptr__,(ulong)(uVar10 + 1),(allocator_type *)&local_78);
  local_78.first_ptr = local_78.buf;
  local_78.write_mode = false;
  puVar1 = (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
           ._M_impl.super__Vector_impl_data._M_start;
  local_78.last_ptr = local_78.buf + 1;
  local_78.in_word_offset = '\0';
  local_78.bytes_written = 0;
  local_78.buf[0] = *(uint32_t *)((long)puVar11 + -3);
  n = (long)(__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
            )._M_impl.super__Vector_impl_data._M_finish - (long)puVar1 >> 2;
  local_78.bytes_consumed = 4;
  local_78.of = (uint32_t *)((long)puVar11 + 1);
  local_78.cur_ptr = local_78.first_ptr;
  interpolative_internal::decode_interpolative
            (&local_78,puVar1,n,1,(1L << ((ulong)(byte)uVar7 & 0x3f)) + 2 + n);
  if ((local_78.write_mode == true) && (local_78.in_word_offset != '\0')) {
    *local_78.of = *local_78.first_ptr;
  }
  if (uVar10 != 0) {
    puVar2 = (__return_storage_ptr__->
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    auVar13 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar14 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar15 = vpbroadcastq_avx512f();
    uVar9 = 0;
    auVar16 = vpbroadcastd_avx512f(ZEXT416(*puVar2));
    do {
      auVar17 = vpbroadcastq_avx512f();
      auVar18 = vporq_avx512f(auVar17,auVar13);
      auVar17 = vporq_avx512f(auVar17,auVar14);
      uVar3 = vpcmpuq_avx512f(auVar17,auVar15,2);
      uVar4 = vpcmpuq_avx512f(auVar18,auVar15,2);
      bVar6 = (byte)uVar4;
      uVar12 = CONCAT11(bVar6,(byte)uVar3);
      auVar17 = vmovdqu32_avx512f(*(undefined1 (*) [64])(puVar2 + uVar9 + 1));
      auVar18._4_4_ = (uint)((byte)(uVar12 >> 1) & 1) * auVar17._4_4_;
      auVar18._0_4_ = (uint)((byte)uVar3 & 1) * auVar17._0_4_;
      auVar18._8_4_ = (uint)((byte)(uVar12 >> 2) & 1) * auVar17._8_4_;
      auVar18._12_4_ = (uint)((byte)(uVar12 >> 3) & 1) * auVar17._12_4_;
      auVar18._16_4_ = (uint)((byte)(uVar12 >> 4) & 1) * auVar17._16_4_;
      auVar18._20_4_ = (uint)((byte)(uVar12 >> 5) & 1) * auVar17._20_4_;
      auVar18._24_4_ = (uint)((byte)(uVar12 >> 6) & 1) * auVar17._24_4_;
      auVar18._28_4_ = (uint)((byte)(uVar12 >> 7) & 1) * auVar17._28_4_;
      auVar18._32_4_ = (uint)(bVar6 & 1) * auVar17._32_4_;
      auVar18._36_4_ = (uint)(bVar6 >> 1 & 1) * auVar17._36_4_;
      auVar18._40_4_ = (uint)(bVar6 >> 2 & 1) * auVar17._40_4_;
      auVar18._44_4_ = (uint)(bVar6 >> 3 & 1) * auVar17._44_4_;
      auVar18._48_4_ = (uint)(bVar6 >> 4 & 1) * auVar17._48_4_;
      auVar18._52_4_ = (uint)(bVar6 >> 5 & 1) * auVar17._52_4_;
      auVar18._56_4_ = (uint)(bVar6 >> 6 & 1) * auVar17._56_4_;
      auVar18._60_4_ = (uint)(bVar6 >> 7) * auVar17._60_4_;
      auVar16 = valignd_avx512f(auVar18,auVar16,0xf);
      auVar16 = vpternlogq_avx512f(auVar16,auVar16,auVar16,0xf);
      auVar16 = vpaddd_avx512f(auVar18,auVar16);
      auVar16 = vmovdqu32_avx512f(auVar16);
      *(undefined1 (*) [64])(puVar2 + uVar9 + 1) = auVar16;
      uVar9 = uVar9 + 0x10;
      auVar16 = vmovdqa64_avx512f(auVar18);
    } while (((ulong)uVar10 + 0xf & 0xfffffffffffffff0) != uVar9);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<uint32_t> ans_load_interp(const uint8_t* in_u8)
{
    uint32_t max_sym = vbyte_decode_u32(in_u8);
    uint32_t frame_size = (1 << (*in_u8++));
    auto in_ptr_u32 = reinterpret_cast<const uint32_t*>(in_u8);
    std::vector<uint32_t> vec(max_sym + 1);
    interpolative_internal::decode(
        in_ptr_u32, vec.data(), vec.size(), frame_size + vec.size() + 1);
    uint32_t prev = vec[0];
    uint32_t max_norm_freq = 0;
    for (size_t sym = 1; sym <= max_sym; sym++) {
        auto cur = vec[sym];
        vec[sym] = cur - prev - 1;
        max_norm_freq = std::max(max_norm_freq, vec[sym]);
        prev = cur;
    }
    return vec;
}